

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O2

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryPullOutOrUncoverCardsFromAnyTableauPile
          (EventsProcessor *this,MouseLeftButtonDown *event)

{
  uint uVar1;
  undefined1 in_AL;
  bool bVar2;
  undefined7 in_register_00000001;
  uint uVar3;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT71(in_register_00000001,in_AL);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 7) break;
    uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28);
    bVar2 = checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile
                      (this,(PileId *)((long)&uStack_28 + 4),event);
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return uVar3 < 7;
}

Assistant:

bool EventsProcessor::
checkIfCollidesAndTryPullOutOrUncoverCardsFromAnyTableauPile(
    const MouseLeftButtonDown& event) const
{
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        if (checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile(id, event))
            return true;
    return false;
}